

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::cose::CoseTest_CoseSignAndVerify_KeyConstruction_Test::
~CoseTest_CoseSignAndVerify_KeyConstruction_Test
          (CoseTest_CoseSignAndVerify_KeyConstruction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoseTest, CoseSignAndVerify_KeyConstruction)
{
    ByteArray content{1, 2, 3, 4, 5, 6};
    ByteArray externalData{6, 5, 4, 3, 2, 1};

    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);

    EXPECT_EQ(ParsePublicKey(publicKey, ByteArray{kCertificate, kCertificate + sizeof(kCertificate)}),
              ErrorCode::kNone);
    EXPECT_EQ(ParsePrivateKey(privateKey, ByteArray{kPrivateKey, kPrivateKey + sizeof(kPrivateKey)}), ErrorCode::kNone);

    ByteArray keyId = {};
    ByteArray encodedCoseKey;
    CborMap   coseKey;

    EXPECT_EQ(MakeCoseKey(encodedCoseKey, publicKey, keyId), ErrorCode::kNone);
    EXPECT_EQ(CborMap::Deserialize(coseKey, &encodedCoseKey[0], encodedCoseKey.size()), ErrorCode::kNone);

    uint8_t buf[1024];
    size_t  bufLength = 0;
    EXPECT_EQ(coseKey.Serialize(buf, bufLength, sizeof(buf)), ErrorCode::kNone);

    int keyType = 0;
    EXPECT_EQ(coseKey.Get(cose::kKeyType, keyType), ErrorCode::kNone);
    EXPECT_EQ(keyType, cose::kKeyTypeEC2);

    int ec2Curve = 0;
    EXPECT_EQ(coseKey.Get(cose::kKeyEC2Curve, ec2Curve), ErrorCode::kNone);
    EXPECT_EQ(ec2Curve, cose::kKeyEC2CurveP256);

    const uint8_t *x;
    size_t         xlen;
    EXPECT_EQ(coseKey.Get(cose::kKeyEC2X, x, xlen), ErrorCode::kNone);

    const uint8_t *y;
    size_t         ylen;
    EXPECT_EQ(coseKey.Get(cose::kKeyEC2Y, y, ylen), ErrorCode::kNone);

    coseKey.Free();
}